

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

ArrayPtr<const_char> kj::_::splitNext(ArrayPtr<const_char> *cursor,char delimiter)

{
  unsigned_long uVar1;
  NullableValue<unsigned_long> *other;
  unsigned_long *puVar2;
  unsigned_long *puVar3;
  size_t end;
  ArrayPtr<const_char> *pAVar4;
  ArrayPtr<const_char> AVar5;
  ArrayPtr<const_char> AVar6;
  char *local_a0;
  unsigned_long *index;
  ArrayPtr<const_char> local_48;
  undefined1 local_38 [8];
  NullableValue<unsigned_long> _index4819;
  char delimiter_local;
  ArrayPtr<const_char> *cursor_local;
  ArrayPtr<const_char> result;
  
  AVar5.size_ = (size_t)result.ptr;
  AVar5.ptr = local_a0;
  _index4819.field_1.value._7_1_ = delimiter;
  ArrayPtr<const_char>::findFirst(&local_48,(char *)cursor);
  other = readMaybe<unsigned_long>((Maybe<unsigned_long> *)&local_48);
  NullableValue<unsigned_long>::NullableValue((NullableValue<unsigned_long> *)local_38,other);
  Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)&local_48);
  puVar2 = NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_38);
  if (puVar2 != (unsigned_long *)0x0) {
    puVar3 = NullableValue<unsigned_long>::operator*((NullableValue<unsigned_long> *)local_38);
    AVar5 = ArrayPtr<const_char>::first(cursor,*puVar3);
    cursor_local = (ArrayPtr<const_char> *)AVar5.ptr;
    uVar1 = *puVar3;
    end = ArrayPtr<const_char>::size(cursor);
    AVar6 = ArrayPtr<const_char>::slice(cursor,uVar1 + 1,end);
    *cursor = AVar6;
  }
  result.ptr = (char *)AVar5.size_;
  NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_38);
  if (puVar2 == (unsigned_long *)0x0) {
    pAVar4 = mv<kj::ArrayPtr<char_const>>(cursor);
    cursor_local = (ArrayPtr<const_char> *)pAVar4->ptr;
    result.ptr = (char *)pAVar4->size_;
    ArrayPtr<const_char>::operator=(cursor,(void *)0x0);
  }
  AVar6.size_ = (size_t)result.ptr;
  AVar6.ptr = (char *)cursor_local;
  return AVar6;
}

Assistant:

kj::ArrayPtr<const char> splitNext(kj::ArrayPtr<const char>& cursor, char delimiter) {
  // Consumes and returns the next item in a delimited list.
  //
  // If a delimiter is found:
  //  - `cursor` is updated to point to the rest of the string after the delimiter.
  //  - The text before the delimiter is returned.
  // If no delimiter is found:
  //  - `cursor` is updated to an empty string.
  //  - The text that had been in `cursor` is returned.
  //
  // (It's up to the caller to stop the loop once `cursor` is empty.)
  KJ_IF_SOME(index, cursor.findFirst(delimiter)) {
    auto part = cursor.first(index);
    cursor = cursor.slice(index + 1, cursor.size());
    return part;
  }
  kj::ArrayPtr<const char> result(kj::mv(cursor));
  cursor = nullptr;

  return result;
}